

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MercatorTile.cpp
# Opt level: O2

vector<mercatortile::Tile,_std::allocator<mercatortile::Tile>_> *
mercatortile::children
          (vector<mercatortile::Tile,_std::allocator<mercatortile::Tile>_> *__return_storage_ptr__,
          Tile *tile,int *zoom)

{
  int iVar1;
  int iVar2;
  vector<mercatortile::Tile,std::allocator<mercatortile::Tile>> *pvVar3;
  undefined8 *puVar4;
  int iVar5;
  initializer_list<mercatortile::Tile> __l;
  Tile local_e8;
  allocator_type local_d9;
  vector<mercatortile::Tile,std::allocator<mercatortile::Tile>> *local_d8;
  int *local_d0;
  deque<mercatortile::Tile,_std::allocator<mercatortile::Tile>_> return_tiles;
  move_iterator<std::_Deque_iterator<mercatortile::Tile,_mercatortile::Tile_&,_mercatortile::Tile_*>_>
  local_78;
  move_iterator<std::_Deque_iterator<mercatortile::Tile,_mercatortile::Tile_&,_mercatortile::Tile_*>_>
  local_50;
  
  local_d8 = (vector<mercatortile::Tile,std::allocator<mercatortile::Tile>> *)__return_storage_ptr__
  ;
  local_d0 = zoom;
  if (tile->z <= *zoom) {
    local_e8.z = tile->z;
    local_e8.x = tile->x;
    local_e8.y = tile->y;
    __l._M_len = 1;
    __l._M_array = &local_e8;
    std::deque<mercatortile::Tile,_std::allocator<mercatortile::Tile>_>::deque
              (&return_tiles,__l,&local_d9);
    while( true ) {
      pvVar3 = local_d8;
      iVar5 = (return_tiles.
               super__Deque_base<mercatortile::Tile,_std::allocator<mercatortile::Tile>_>._M_impl.
               super__Deque_impl_data._M_start._M_cur)->z;
      if (*local_d0 <= iVar5) break;
      iVar1 = (return_tiles.
               super__Deque_base<mercatortile::Tile,_std::allocator<mercatortile::Tile>_>._M_impl.
               super__Deque_impl_data._M_start._M_cur)->x;
      iVar2 = (return_tiles.
               super__Deque_base<mercatortile::Tile,_std::allocator<mercatortile::Tile>_>._M_impl.
               super__Deque_impl_data._M_start._M_cur)->y;
      std::deque<mercatortile::Tile,_std::allocator<mercatortile::Tile>_>::pop_front(&return_tiles);
      iVar1 = iVar1 * 2;
      iVar2 = iVar2 * 2;
      local_e8.y = iVar2;
      local_e8.x = iVar1;
      iVar5 = iVar5 + 1;
      local_e8.z = iVar5;
      std::deque<mercatortile::Tile,_std::allocator<mercatortile::Tile>_>::
      emplace_back<mercatortile::Tile>(&return_tiles,&local_e8);
      local_e8._0_8_ = CONCAT44(iVar2,iVar1) | 1;
      local_e8.z = iVar5;
      std::deque<mercatortile::Tile,_std::allocator<mercatortile::Tile>_>::
      emplace_back<mercatortile::Tile>(&return_tiles,&local_e8);
      local_e8._0_8_ = CONCAT44(iVar2,iVar1) | 0x100000000;
      local_e8.z = iVar5;
      std::deque<mercatortile::Tile,_std::allocator<mercatortile::Tile>_>::
      emplace_back<mercatortile::Tile>(&return_tiles,&local_e8);
      local_e8._0_8_ = CONCAT44(iVar2,iVar1) | 0x100000001;
      local_e8.z = iVar5;
      std::deque<mercatortile::Tile,_std::allocator<mercatortile::Tile>_>::
      emplace_back<mercatortile::Tile>(&return_tiles,&local_e8);
    }
    local_50._M_current._M_cur =
         return_tiles.super__Deque_base<mercatortile::Tile,_std::allocator<mercatortile::Tile>_>.
         _M_impl.super__Deque_impl_data._M_start._M_cur;
    local_50._M_current._M_first =
         return_tiles.super__Deque_base<mercatortile::Tile,_std::allocator<mercatortile::Tile>_>.
         _M_impl.super__Deque_impl_data._M_start._M_first;
    local_50._M_current._M_last =
         return_tiles.super__Deque_base<mercatortile::Tile,_std::allocator<mercatortile::Tile>_>.
         _M_impl.super__Deque_impl_data._M_start._M_last;
    local_50._M_current._M_node =
         return_tiles.super__Deque_base<mercatortile::Tile,_std::allocator<mercatortile::Tile>_>.
         _M_impl.super__Deque_impl_data._M_start._M_node;
    local_78._M_current._M_cur =
         return_tiles.super__Deque_base<mercatortile::Tile,_std::allocator<mercatortile::Tile>_>.
         _M_impl.super__Deque_impl_data._M_finish._M_cur;
    local_78._M_current._M_first =
         return_tiles.super__Deque_base<mercatortile::Tile,_std::allocator<mercatortile::Tile>_>.
         _M_impl.super__Deque_impl_data._M_finish._M_first;
    local_78._M_current._M_last =
         return_tiles.super__Deque_base<mercatortile::Tile,_std::allocator<mercatortile::Tile>_>.
         _M_impl.super__Deque_impl_data._M_finish._M_last;
    local_78._M_current._M_node =
         return_tiles.super__Deque_base<mercatortile::Tile,_std::allocator<mercatortile::Tile>_>.
         _M_impl.super__Deque_impl_data._M_finish._M_node;
    std::vector<mercatortile::Tile,std::allocator<mercatortile::Tile>>::
    vector<std::move_iterator<std::_Deque_iterator<mercatortile::Tile,mercatortile::Tile&,mercatortile::Tile*>>,void>
              (local_d8,&local_50,&local_78,(allocator_type *)&local_e8);
    std::_Deque_base<mercatortile::Tile,_std::allocator<mercatortile::Tile>_>::~_Deque_base
              (&return_tiles.
                super__Deque_base<mercatortile::Tile,_std::allocator<mercatortile::Tile>_>);
    return (vector<mercatortile::Tile,_std::allocator<mercatortile::Tile>_> *)pvVar3;
  }
  puVar4 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar4 = "zoom should be greater than tile zoom level.";
  __cxa_throw(puVar4,&char_const*::typeinfo,0);
}

Assistant:

std::vector<Tile> children(const Tile &tile, const int &zoom)
{
    if (tile.z > zoom)
    {
        throw "zoom should be greater than tile zoom level.";
    };
    std::deque<Tile> return_tiles = {tile};
    while (return_tiles.front().z < zoom)
    {
        Tile front_tile = return_tiles.front();
        return_tiles.pop_front();
        return_tiles.push_back(Tile{front_tile.x * 2, front_tile.y * 2, front_tile.z + 1});
        return_tiles.push_back(Tile{front_tile.x * 2 + 1, front_tile.y * 2, front_tile.z + 1});
        return_tiles.push_back(Tile{front_tile.x * 2, front_tile.y * 2 + 1, front_tile.z + 1});
        return_tiles.push_back(Tile{front_tile.x * 2 + 1, front_tile.y * 2 + 1, front_tile.z + 1});
    }

    //TODO: hight memory, not efficiency, or consider anthoer method.
    vector<Tile> return_vector_tiles(std::make_move_iterator(return_tiles.begin()),
                                     std::make_move_iterator(return_tiles.end()));
    // copy(return_tiles.begin(), return_tiles.end(), back_inserter(return_vector_tiles));

    return return_vector_tiles;
}